

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MunitionDescriptor.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::MunitionDescriptor::operator==(MunitionDescriptor *this,MunitionDescriptor *Value)

{
  KBOOL KVar1;
  MunitionDescriptor *Value_local;
  MunitionDescriptor *this_local;
  
  KVar1 = Descriptor::operator!=(&this->super_Descriptor,&Value->super_Descriptor);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui16Warhead == Value->m_ui16Warhead) {
    if (this->m_ui16Fuse == Value->m_ui16Fuse) {
      if (this->m_ui16Quantity == Value->m_ui16Quantity) {
        if (this->m_ui16Rate == Value->m_ui16Rate) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL MunitionDescriptor::operator == ( const MunitionDescriptor & Value ) const
{
	if( Descriptor::operator != ( Value ) )            return false;
    if( m_ui16Warhead        != Value.m_ui16Warhead )  return false;
    if( m_ui16Fuse           != Value.m_ui16Fuse )     return false;
    if( m_ui16Quantity       != Value.m_ui16Quantity ) return false;
    if( m_ui16Rate           != Value.m_ui16Rate )     return false;
    return true;
}